

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigrp-packet.cc
# Opt level: O1

void __thiscall Ipv4InternalTlv::Print(Ipv4InternalTlv *this,ostream *os)

{
  ostream *poVar1;
  char local_51;
  string local_50;
  
  local_50._M_dataplus._M_p._0_1_ = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Ipv4 Internal TLV:",0x12);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\t\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"type: ",6);
  std::__ostream_insert<char,std::char_traits<char>>(os,"0x0102",6);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\t\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"length: ",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\t\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"nexthop: ",9);
  num2ip_abi_cxx11_(&local_50,*(uint32_t *)&(this->super_Tlv).field_0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                          local_50._M_dataplus._M_p._0_1_),local_50._M_string_length
                     );
  local_51 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_51,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\t\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"prefix length: ",0xf);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\t\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"destination: ",0xd);
  num2ip_abi_cxx11_(&local_50,this->destination);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                          local_50._M_dataplus._M_p._0_1_),local_50._M_string_length
                     );
  local_51 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_51,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
      &local_50.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\t\t",2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"metric:",7);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\t\t\t",3);
  std::__ostream_insert<char,std::char_traits<char>>(os,"scaled delay: ",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\t\t\t",3);
  std::__ostream_insert<char,std::char_traits<char>>(os,"scaled bandwidth: ",0x12);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\t\t\t",3);
  std::__ostream_insert<char,std::char_traits<char>>(os,"mtu: ",5);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\t\t\t",3);
  std::__ostream_insert<char,std::char_traits<char>>(os,"hop count: ",0xb);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  local_50._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_50,1);
  return;
}

Assistant:

void Ipv4InternalTlv::Print(std::ostream& os)
{
    os << '\t' << "Ipv4 Internal TLV:" << '\n';
    os << "\t\t"
       << "type: "
       << "0x0102" << '\n';
    os << "\t\t"
       << "length: " << tlen << '\n';
    os << "\t\t"
       << "nexthop: " << num2ip(nexthop) << '\n';
    os << "\t\t"
       << "prefix length: " << (uint32_t)prefixlen << '\n';
    os << "\t\t"
       << "destination: " << num2ip(destination) << '\n';
    os << "\t\t"
       << "metric:" << '\n';
    os << "\t\t\t"
       << "scaled delay: " << delay << '\n';
    os << "\t\t\t"
       << "scaled bandwidth: " << bandwidth << '\n';
    os << "\t\t\t"
       << "mtu: " << mtu << '\n';
    os << "\t\t\t"
       << "hop count: " << hop_count << '\n';
}